

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCuesData.cpp
# Opt level: O0

void __thiscall
libmatroska::KaxCueReference::AddReference
          (KaxCueReference *this,KaxBlockBlob *BlockReference,uint64 GlobalTimecodeScale)

{
  KaxInternalBlock *this_00;
  EbmlUInteger *pEVar1;
  uint64 uVar2;
  KaxCueRefCluster *TheClustPos;
  KaxCueRefTime *NewTime;
  KaxInternalBlock *theBlock;
  uint64 GlobalTimecodeScale_local;
  KaxBlockBlob *BlockReference_local;
  KaxCueReference *this_local;
  
  this_00 = KaxBlockBlob::operator_cast_to_KaxInternalBlock_(BlockReference);
  pEVar1 = &libebml::GetChild<libmatroska::KaxCueRefTime>(&this->super_EbmlMaster)->
            super_EbmlUInteger;
  uVar2 = KaxInternalBlock::GlobalTimecode(this_00);
  libebml::EbmlUInteger::operator=(pEVar1,uVar2 / GlobalTimecodeScale);
  pEVar1 = &libebml::GetChild<libmatroska::KaxCueRefCluster>(&this->super_EbmlMaster)->
            super_EbmlUInteger;
  uVar2 = KaxInternalBlock::ClusterPosition(this_00);
  libebml::EbmlUInteger::operator=(pEVar1,uVar2);
  return;
}

Assistant:

void KaxCueReference::AddReference(const KaxBlockBlob & BlockReference, uint64 GlobalTimecodeScale)
{
  const KaxInternalBlock & theBlock = BlockReference;
  KaxCueRefTime & NewTime = GetChild<KaxCueRefTime>(*this);
  *static_cast<EbmlUInteger*>(&NewTime) = theBlock.GlobalTimecode() / GlobalTimecodeScale;

  KaxCueRefCluster & TheClustPos = GetChild<KaxCueRefCluster>(*this);
  *static_cast<EbmlUInteger*>(&TheClustPos) = theBlock.ClusterPosition();

#ifdef OLD
  // handle recursive reference use
  if (BlockReference.ReferenceCount() != 0) {
    unsigned int i;
    for (i=0; i<BlockReference.ReferenceCount(); i++) {
      AddReference(BlockReference.Reference(i).RefBlock());
    }
  }
#endif /* OLD */
}